

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  char_t *pcVar1;
  char_t cVar2;
  xml_node_struct *pxVar3;
  bool bVar4;
  xml_node xVar5;
  size_t count;
  size_t sVar6;
  xml_node_struct **ppxVar7;
  xml_node *this_00;
  char_t *pcVar8;
  char_t *rhs;
  char_t *pcVar9;
  char_t *path__00;
  xml_node found;
  xml_node local_40;
  xml_node local_38;
  
  local_38 = (xml_node)this->_root;
  if ((local_38._root != (xml_node_struct *)0x0) && (*path_ != '\0')) {
    if (*path_ == delimiter) {
      path_ = path_ + 1;
      local_38._root =
           (xml_node_struct *)
           (*(long *)((long)local_38._root - ((local_38._root)->header >> 8)) + -0x40);
    }
    rhs = path_ + -1;
    do {
      pcVar8 = rhs;
      cVar2 = pcVar8[1];
      rhs = pcVar8 + 1;
    } while (cVar2 == delimiter);
    sVar6 = 0;
    do {
      count = sVar6;
      sVar6 = count + 1;
      if (rhs[count] == '\0') break;
    } while (rhs[count] != delimiter);
    if (sVar6 != 1) {
      pcVar9 = pcVar8 + count;
      do {
        path__00 = pcVar9 + 1;
        pcVar1 = pcVar9 + 1;
        pcVar9 = path__00;
      } while (*pcVar1 == delimiter);
      if (sVar6 == 2 && cVar2 == '.') {
        this_00 = &local_38;
      }
      else {
        if (((cVar2 != '.') || (sVar6 != 3)) || (pcVar8[2] != '.')) {
          ppxVar7 = &(local_38._root)->first_child;
          while( true ) {
            pxVar3 = *ppxVar7;
            if (pxVar3 == (xml_node_struct *)0x0) {
              return (xml_node)(xml_node_struct *)0x0;
            }
            if (((pxVar3->name != (char_t *)0x0) &&
                (bVar4 = impl::anon_unknown_0::strequalrange(pxVar3->name,rhs,count), bVar4)) &&
               (local_40._root = pxVar3, xVar5 = first_element_by_path(&local_40,path__00,delimiter)
               , xVar5._root != (xml_node_struct *)0x0)) break;
            ppxVar7 = &pxVar3->next_sibling;
          }
          return (xml_node)xVar5._root;
        }
        local_40._root = (local_38._root)->parent;
        this_00 = &local_40;
      }
      local_38 = first_element_by_path(this_00,path__00,delimiter);
    }
  }
  return (xml_node)local_38._root;
}

Assistant:

PUGI__FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node found = *this; // Current search context.

		if (!_root || !path_[0]) return found;

		if (path_[0] == delimiter)
		{
			// Absolute path; e.g. '/foo/bar'
			found = found.root();
			++path_;
		}

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return found;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return found.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return found.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = found._root->first_child; j; j = j->next_sibling)
			{
				if (j->name && impl::strequalrange(j->name, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}